

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

SampledSpectrum *
phyr::SampledSpectrum::getFromRGB
          (SampledSpectrum *__return_storage_ptr__,double *rgb,SpectrumType type)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  undefined1 auVar6 [16];
  CoefficientSpectrum<60> cs;
  SampledSpectrum r;
  double local_3d8 [60];
  double local_1f8 [60];
  
  memset(local_1f8,0,0x1e0);
  dVar2 = *rgb;
  dVar3 = rgb[1];
  if (type == Reflectance) {
    if ((dVar3 < dVar2) || (dVar1 = rgb[2], dVar1 < dVar2)) {
      dVar1 = rgb[2];
      if ((dVar2 < dVar3) || (dVar1 < dVar3)) {
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1abc48);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectWhite + lVar5) * dVar1;
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar1;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar4 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        if (dVar2 <= dVar3) {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ac788);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectYellow + lVar5) * (dVar2 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar2 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar1 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar1;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar1 = *(double *)(lVar5 + 0x1ac1e8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectGreen + lVar5) * (dVar3 - dVar2);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar1 * (dVar3 - dVar2);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
        else {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ac788);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectYellow + lVar5) * (dVar3 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar3 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar1 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar1;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar1 = *(double *)(lVar5 + 0x1ac5a8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectRed + lVar5) * (dVar2 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar1 * (dVar2 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
      }
      else {
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1abc48);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectWhite + lVar5) * dVar3;
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar3;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar4 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        if (dVar2 <= dVar1) {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ac3c8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectMagenta + lVar5) * (dVar2 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar2 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar3 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar3;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar3 = *(double *)(lVar5 + 0x1ac008);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectBlue + lVar5) * (dVar1 - dVar2);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar3 * (dVar1 - dVar2);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
        else {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ac3c8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectMagenta + lVar5) * (dVar1 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar1 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar3 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar3;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar3 = *(double *)(lVar5 + 0x1ac5a8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbRefl2SpectRed + lVar5) * (dVar2 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar3 * (dVar2 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
      }
    }
    else {
      lVar5 = 0;
      memset(local_3d8,0,0x1e0);
      do {
        dVar4 = *(double *)(lVar5 + 0x1abc48);
        *(double *)((long)local_3d8 + lVar5) =
             *(double *)((long)&rgbRefl2SpectWhite + lVar5) * dVar2;
        *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar2;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x1e0);
      lVar5 = 0;
      do {
        dVar4 = local_3d8[lVar5 + 1];
        local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
        local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 0x3c);
      lVar5 = 0;
      if (dVar3 <= dVar1) {
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1abe28);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectCyan + lVar5) * (dVar3 - dVar2);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar3 - dVar2);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar2 = *(double *)(lVar5 + 0x1ac008);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectBlue + lVar5) * (dVar1 - dVar3);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar2 * (dVar1 - dVar3);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
      }
      else {
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1abe28);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectCyan + lVar5) * (dVar1 - dVar2);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar1 - dVar2);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar2 = *(double *)(lVar5 + 0x1ac1e8);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbRefl2SpectGreen + lVar5) * (dVar3 - dVar1);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar2 * (dVar3 - dVar1);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
      }
    }
    lVar5 = 0;
    do {
      local_1f8[lVar5] = local_1f8[lVar5] * 0.94;
      local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] * 0.94;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
  }
  else {
    if ((dVar3 < dVar2) || (dVar1 = rgb[2], dVar1 < dVar2)) {
      dVar1 = rgb[2];
      if ((dVar2 < dVar3) || (dVar1 < dVar3)) {
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1ac968);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectWhite + lVar5) * dVar1;
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar1;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar4 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        if (dVar2 <= dVar3) {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ad4a8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectYellow + lVar5) * (dVar2 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar2 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar1 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar1;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar1 = *(double *)(lVar5 + 0x1acf08);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectGreen + lVar5) * (dVar3 - dVar2);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar1 * (dVar3 - dVar2);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
        else {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ad4a8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectYellow + lVar5) * (dVar3 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar3 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar1 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar1;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar1 = *(double *)(lVar5 + 0x1ad2c8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectRed + lVar5) * (dVar2 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar1 * (dVar2 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
      }
      else {
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1ac968);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectWhite + lVar5) * dVar3;
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar3;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar4 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        if (dVar2 <= dVar1) {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ad0e8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectMagenta + lVar5) * (dVar2 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar2 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar3 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar3;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar3 = *(double *)(lVar5 + 0x1acd28);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectBlue + lVar5) * (dVar1 - dVar2);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar3 * (dVar1 - dVar2);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
        else {
          memset(local_3d8,0,0x1e0);
          do {
            dVar4 = *(double *)(lVar5 + 0x1ad0e8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectMagenta + lVar5) * (dVar1 - dVar3);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar1 - dVar3);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar3 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar3;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
          lVar5 = 0;
          memset(local_3d8,0,0x1e0);
          do {
            dVar3 = *(double *)(lVar5 + 0x1ad2c8);
            *(double *)((long)local_3d8 + lVar5) =
                 *(double *)((long)&rgbIllum2SpectRed + lVar5) * (dVar2 - dVar1);
            *(double *)((long)local_3d8 + lVar5 + 8) = dVar3 * (dVar2 - dVar1);
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x1e0);
          lVar5 = 0;
          do {
            dVar2 = local_3d8[lVar5 + 1];
            local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
            local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 != 0x3c);
        }
      }
    }
    else {
      lVar5 = 0;
      memset(local_3d8,0,0x1e0);
      do {
        dVar4 = *(double *)(lVar5 + 0x1ac968);
        *(double *)((long)local_3d8 + lVar5) =
             *(double *)((long)&rgbIllum2SpectWhite + lVar5) * dVar2;
        *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * dVar2;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x1e0);
      lVar5 = 0;
      do {
        dVar4 = local_3d8[lVar5 + 1];
        local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
        local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar4;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 0x3c);
      lVar5 = 0;
      if (dVar3 <= dVar1) {
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1acb48);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectCyan + lVar5) * (dVar3 - dVar2);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar3 - dVar2);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar2 = *(double *)(lVar5 + 0x1acd28);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectBlue + lVar5) * (dVar1 - dVar3);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar2 * (dVar1 - dVar3);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
      }
      else {
        memset(local_3d8,0,0x1e0);
        do {
          dVar4 = *(double *)(lVar5 + 0x1acb48);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectCyan + lVar5) * (dVar1 - dVar2);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar4 * (dVar1 - dVar2);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
        lVar5 = 0;
        memset(local_3d8,0,0x1e0);
        do {
          dVar2 = *(double *)(lVar5 + 0x1acf08);
          *(double *)((long)local_3d8 + lVar5) =
               *(double *)((long)&rgbIllum2SpectGreen + lVar5) * (dVar3 - dVar1);
          *(double *)((long)local_3d8 + lVar5 + 8) = dVar2 * (dVar3 - dVar1);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x1e0);
        lVar5 = 0;
        do {
          dVar2 = local_3d8[lVar5 + 1];
          local_1f8[lVar5] = local_1f8[lVar5] + local_3d8[lVar5];
          local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] + dVar2;
          lVar5 = lVar5 + 2;
        } while (lVar5 != 0x3c);
      }
    }
    lVar5 = 0;
    do {
      local_1f8[lVar5] = local_1f8[lVar5] * 0.8644499778747559;
      local_1f8[lVar5 + 1] = local_1f8[lVar5 + 1] * 0.8644499778747559;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
  }
  lVar5 = 0;
  memset(local_3d8,0,0x1e0);
  do {
    auVar6 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(local_1f8 + lVar5));
    *(undefined1 (*) [16])(local_3d8 + lVar5) = auVar6;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0x3c);
  memcpy(__return_storage_ptr__,local_3d8,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromRGB(const Real rgb[3], SpectrumType type) {
    SampledSpectrum r;
    if (type == SpectrumType::Reflectance) {
        // Convert reflectance spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbRefl2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute reflectance _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbRefl2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbRefl2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectRed;
            }
        } else {
            // Compute reflectance _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbRefl2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbRefl2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbRefl2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbRefl2SpectRed;
            }
        }
        r *= .94;
    } else {
        // Convert illuminant spectrum to RGB
        if (rgb[0] <= rgb[1] && rgb[0] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[0]_ as minimum
            r += rgb[0] * rgbIllum2SpectWhite;
            if (rgb[1] <= rgb[2]) {
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectCyan;
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectGreen;
            }
        } else if (rgb[1] <= rgb[0] && rgb[1] <= rgb[2]) {
            // Compute illuminant _SampledSpectrum_ with _rgb[1]_ as minimum
            r += rgb[1] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[2]) {
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[2] - rgb[0]) * rgbIllum2SpectBlue;
            } else {
                r += (rgb[2] - rgb[1]) * rgbIllum2SpectMagenta;
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectRed;
            }
        } else {
            // Compute illuminant _SampledSpectrum_ with _rgb[2]_ as minimum
            r += rgb[2] * rgbIllum2SpectWhite;
            if (rgb[0] <= rgb[1]) {
                r += (rgb[0] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[1] - rgb[0]) * rgbIllum2SpectGreen;
            } else {
                r += (rgb[1] - rgb[2]) * rgbIllum2SpectYellow;
                r += (rgb[0] - rgb[1]) * rgbIllum2SpectRed;
            }
        }
        r *= .86445f;
    }

    return r.clamp();
}